

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void __thiscall GB::Write_ROM(GB *this,u16 addr,u8 val)

{
  pointer puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  sbyte sVar5;
  uint uVar6;
  undefined6 in_register_00000032;
  ulong uVar7;
  byte bVar8;
  bool bVar9;
  
  uVar7 = CONCAT62(in_register_00000032,addr) >> 0xc & 0xfffff;
  if ((ushort)uVar7 < 8) {
    (*(code *)(&DAT_0010c91c + *(int *)(&DAT_0010c91c + uVar7 * 4)))();
    return;
  }
  bVar2 = 1;
  uVar6 = 0;
  bVar3 = 0;
  switch((this->cart).mbc) {
  case _1:
    sVar5 = 5;
    bVar4 = 0x1f;
    goto LAB_001096b1;
  case _1M:
    sVar5 = 4;
    bVar4 = 0xf;
LAB_001096b1:
    bVar3 = (this->s).mbc_45xxx & 3;
    bVar2 = bVar3 << sVar5;
    bVar9 = (this->s).mbc_mode == '\0';
    if (bVar9) {
      bVar3 = 0;
    }
    uVar6 = 0;
    if (!bVar9) {
      uVar6 = (uint)bVar2;
    }
    bVar4 = bVar4 & (this->s).mbc_23xxx;
    bVar8 = 1;
    if (1 < bVar4) {
      bVar8 = bVar4;
    }
    bVar2 = bVar2 | bVar8;
    goto switchD_00109662_caseD_6;
  case _2:
    bVar2 = (this->s).mbc_23xxx & 0xf;
    bVar3 = 0;
    break;
  case _3:
    bVar2 = (this->s).mbc_23xxx & 0x7f;
    bVar3 = (this->s).mbc_45xxx & 7;
    break;
  case _5:
    bVar2 = (this->s).mbc_2xxx;
    bVar3 = (this->s).mbc_45xxx & 0xf;
    break;
  default:
    goto switchD_00109662_caseD_6;
  case HUC1:
    bVar3 = (this->s).mbc_45xxx;
    bVar4 = (this->s).mbc_23xxx & 0x3f;
    bVar2 = 1;
    if (1 < bVar4) {
      bVar2 = bVar4;
    }
    if ((this->s).mbc_mode == '\0') {
      bVar2 = bVar3 << 6 | bVar2;
      uVar6 = 0;
      bVar3 = 0;
      goto switchD_00109662_caseD_6;
    }
  }
  uVar6 = 0;
switchD_00109662_caseD_6:
  puVar1 = (this->rom).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar4 = (this->cart).rom_bank_mask;
  (this->s).rom0p = puVar1 + ((uVar6 & bVar4) << 0xe);
  (this->s).rom1p = puVar1 + (ulong)(bVar2 & bVar4) * 0x4000;
  (this->s).sramp = (this->s).sram + (ulong)(bVar3 & (this->cart).sram_bank_mask) * 0x2000;
  return;
}

Assistant:

void GB::Write_ROM(u16 addr, u8 val) {
  switch (addr >> 12) {
    case 0: case 1: s.sram_enabled = (val & 0xf) == 0xa; break;
    case 2: s.mbc_2xxx = val; s.mbc_23xxx = val; break;
    case 3: s.mbc_3xxx = val; s.mbc_23xxx = val; break;
    case 4: case 5: s.mbc_45xxx = val; break;
    case 6: case 7: s.mbc_mode = val; break;
  }

  u8 rom0_bank = 0, rom1_bank = 1, sram_bank = 0;
  switch (cart.mbc) {
    {
      u8 mask, shift;
      case MBC::_1: mask = 0x1f; shift = 5; goto mbc1_shared;
      case MBC::_1M: mask = 0xf; shift = 4; goto mbc1_shared;
      mbc1_shared:
        u8 hi_bank = (s.mbc_45xxx & 3) << shift;
        if (s.mbc_mode) {
          rom0_bank |= hi_bank;
          sram_bank = (s.mbc_45xxx & 3);
        }
        rom1_bank = s.mbc_23xxx & mask;
        if (rom1_bank == 0) {
          ++rom1_bank;
        }
        rom1_bank |= hi_bank;
        break;
    }
    case MBC::_2:
      rom1_bank = s.mbc_23xxx & 0xf;
      break;
    case MBC::_3:
      rom1_bank = s.mbc_23xxx & 0x7f;
      sram_bank = s.mbc_45xxx & 0x7;
      break;
    case MBC::_5:
      rom1_bank = ((s.mbc_3xxx & 1) << 8) | s.mbc_2xxx;
      sram_bank = s.mbc_45xxx & 0xf;
      break;
    case MBC::HUC1: {
      rom1_bank = s.mbc_23xxx & 0x3f;
      if (rom1_bank == 0) { rom1_bank++; }
      if (s.mbc_mode) {
        sram_bank = s.mbc_45xxx;
      } else {
        rom1_bank |= (s.mbc_45xxx & 3) << 6;
      }
      break;
    }
    case MBC::MMM01: break;  // TODO
    default: break;
  }
  s.rom0p = rom.data() + ((rom0_bank & cart.rom_bank_mask) << 14);
  s.rom1p = rom.data() + ((rom1_bank & cart.rom_bank_mask) << 14);
  s.sramp = s.sram + ((sram_bank & cart.sram_bank_mask) << 13);
}